

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

bool __thiscall
cmGeneratorTarget::GetConfigCommonSourceFiles
          (cmGeneratorTarget *this,vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *files)

{
  cmLocalGenerator *this_00;
  pointer ppcVar1;
  string *psVar2;
  int iVar3;
  string *psVar4;
  ostream *poVar5;
  pointer config;
  undefined4 uVar6;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *files_00;
  pointer ppcVar7;
  const_iterator fi;
  pointer ppcVar8;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> configFiles;
  string thisConfigFiles;
  string firstConfigFiles;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  ostringstream e;
  bool local_279;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> local_278;
  string *local_258;
  string local_250;
  undefined4 local_22c;
  char *local_228;
  long local_220;
  char local_218;
  undefined7 uStack_217;
  char *local_208;
  long local_200;
  char local_1f8;
  undefined7 uStack_1f7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e8;
  string *local_1d0;
  string local_1c8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_1e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_1e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_1e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmMakefile::GetConfigurations(&local_1c8,this->Makefile,&local_1e8,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if (local_1e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_1e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1e8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
  }
  config = local_1e8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  GetSourceFilesWithoutObjectLibraries
            (this,files,
             local_1e8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  local_279 = config == local_1e8.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
  if (!local_279) {
    local_1d0 = config;
    do {
      local_278.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_278.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_278.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      files_00 = &local_278;
      local_258 = config;
      GetSourceFilesWithoutObjectLibraries(this,files_00,config);
      ppcVar1 = local_278.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      ppcVar8 = (files->super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>)._M_impl
                .super__Vector_impl_data._M_start;
      uVar6 = (undefined4)CONCAT71((int7)((ulong)files_00 >> 8),1);
      if ((long)local_278.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)local_278.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                _M_impl.super__Vector_impl_data._M_start ==
          (long)(files->super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>)._M_impl
                .super__Vector_impl_data._M_finish - (long)ppcVar8) {
        if (local_278.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_278.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_start) {
          uVar6 = 0;
        }
        else {
          ppcVar7 = ppcVar8;
          iVar3 = bcmp(local_278.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                       ._M_impl.super__Vector_impl_data._M_start,ppcVar8,
                       (long)local_278.
                             super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_278.
                             super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                             _M_impl.super__Vector_impl_data._M_start);
          uVar6 = (undefined4)CONCAT71((int7)((ulong)ppcVar7 >> 8),iVar3 != 0);
        }
      }
      psVar2 = local_1d0;
      if ((char)uVar6 == '\0') {
        if (ppcVar1 != (pointer)0x0) {
          operator_delete(ppcVar1,(long)local_278.
                                        super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)ppcVar1);
        }
      }
      else {
        local_208 = &local_1f8;
        local_200 = 0;
        local_1f8 = '\0';
        local_22c = uVar6;
        if (ppcVar8 !=
            (files->super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>)._M_impl.
            super__Vector_impl_data._M_finish) {
          do {
            std::__cxx11::string::append((char *)&local_208);
            psVar4 = cmSourceFile::GetFullPath(*ppcVar8,(string *)0x0);
            std::__cxx11::string::_M_append((char *)&local_208,(ulong)(psVar4->_M_dataplus)._M_p);
            ppcVar8 = ppcVar8 + 1;
          } while (ppcVar8 !=
                   (files->super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>).
                   _M_impl.super__Vector_impl_data._M_finish);
        }
        local_228 = &local_218;
        local_220 = 0;
        local_218 = '\0';
        ppcVar8 = local_278.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if (local_278.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_start !=
            local_278.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          do {
            std::__cxx11::string::append((char *)&local_228);
            psVar4 = cmSourceFile::GetFullPath(*ppcVar8,(string *)0x0);
            std::__cxx11::string::_M_append((char *)&local_228,(ulong)(psVar4->_M_dataplus)._M_p);
            ppcVar8 = ppcVar8 + 1;
          } while (ppcVar8 !=
                   local_278.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Target \"",8);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(this->Target->Name)._M_dataplus._M_p,
                            (this->Target->Name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,
                   "\" has source files which vary by configuration. This is not supported by the \""
                   ,0x4e);
        (*this->GlobalGenerator->_vptr_cmGlobalGenerator[3])(&local_250);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_250._M_dataplus._M_p,local_250._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" generator.\nConfig \"",0x15);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,(psVar2->_M_dataplus)._M_p,psVar2->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\":\n  ",5);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_208,local_200);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\nConfig \"",9);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,(local_258->_M_dataplus)._M_p,local_258->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\":\n  ",5);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_228,local_220);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != &local_250.field_2) {
          operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
        }
        this_00 = this->LocalGenerator;
        std::__cxx11::stringbuf::str();
        cmLocalGenerator::IssueMessage(this_00,FATAL_ERROR,&local_250);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != &local_250.field_2) {
          operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        if (local_228 != &local_218) {
          operator_delete(local_228,CONCAT71(uStack_217,local_218) + 1);
        }
        if (local_208 != &local_1f8) {
          operator_delete(local_208,CONCAT71(uStack_1f7,local_1f8) + 1);
        }
        if (local_278.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_278.
                          super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_278.
                                super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_278.
                                super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if ((char)local_22c != '\0') break;
      }
      config = local_258 + 1;
      local_279 = config == local_1e8.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
    } while (!local_279);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1e8);
  return local_279;
}

Assistant:

bool cmGeneratorTarget::GetConfigCommonSourceFiles(
  std::vector<cmSourceFile*>& files) const
{
  std::vector<std::string> configs;
  this->Makefile->GetConfigurations(configs);
  if (configs.empty()) {
    configs.push_back("");
  }

  std::vector<std::string>::const_iterator it = configs.begin();
  const std::string& firstConfig = *it;
  this->GetSourceFilesWithoutObjectLibraries(files, firstConfig);

  for (; it != configs.end(); ++it) {
    std::vector<cmSourceFile*> configFiles;
    this->GetSourceFilesWithoutObjectLibraries(configFiles, *it);
    if (configFiles != files) {
      std::string firstConfigFiles;
      const char* sep = "";
      for (std::vector<cmSourceFile*>::const_iterator fi = files.begin();
           fi != files.end(); ++fi) {
        firstConfigFiles += sep;
        firstConfigFiles += (*fi)->GetFullPath();
        sep = "\n  ";
      }

      std::string thisConfigFiles;
      sep = "";
      for (std::vector<cmSourceFile*>::const_iterator fi = configFiles.begin();
           fi != configFiles.end(); ++fi) {
        thisConfigFiles += sep;
        thisConfigFiles += (*fi)->GetFullPath();
        sep = "\n  ";
      }
      std::ostringstream e;
      /* clang-format off */
      e << "Target \"" << this->GetName()
        << "\" has source files which vary by "
        "configuration. This is not supported by the \""
        << this->GlobalGenerator->GetName()
        << "\" generator.\n"
          "Config \"" << firstConfig << "\":\n"
          "  " << firstConfigFiles << "\n"
          "Config \"" << *it << "\":\n"
          "  " << thisConfigFiles << "\n";
      /* clang-format on */
      this->LocalGenerator->IssueMessage(cmake::FATAL_ERROR, e.str());
      return false;
    }
  }
  return true;
}